

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerResults.cpp
# Opt level: O3

void __thiscall
OneWireAnalyzerResults::GenerateFrameTabularText
          (OneWireAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  char *pcVar1;
  Frame frame;
  char number_str [128];
  Frame local_c0 [16];
  ulonglong local_b0;
  undefined1 local_a0;
  byte local_9f;
  char local_98 [128];
  
  AnalyzerResults::GetFrame((ulonglong)local_c0);
  AnalyzerResults::ClearTabularText();
  AnalyzerHelpers::GetNumberString(local_b0,display_base,8,local_98,0x80);
  switch(local_a0) {
  case 0:
    pcVar1 = "RESET - warning, pulse shorter than 480us";
    if ((local_9f & 0x40) == 0) {
      pcVar1 = "RESET condition";
    }
    goto LAB_00107675;
  case 1:
    pcVar1 = "PRESENCE condition";
    goto LAB_00107675;
  case 2:
    pcVar1 = "READ ROM command: [";
    break;
  case 3:
    pcVar1 = "SKIP ROM command: [";
    break;
  case 4:
    pcVar1 = "SEARCH ROM command: [";
    break;
  case 5:
    pcVar1 = "MATCH ROM command: [";
    break;
  case 6:
    pcVar1 = "OVERDRIVE SKIP ROM command: [";
    break;
  case 7:
    pcVar1 = "OVERDRIVE MATCH ROM command: [";
    break;
  case 8:
    pcVar1 = "CRC section from ROM: [";
    break;
  case 9:
    pcVar1 = "FAMILY CODE section from ROM: [";
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_b0,display_base,0x30,local_98,0x80);
    pcVar1 = "ROM CODE section from ROM: [";
    break;
  case 0xb:
    pcVar1 = "DATA: [";
    break;
  case 0xc:
    pcVar1 = "BIT - ERROR.";
LAB_00107675:
    AnalyzerResults::AddTabularText
              ((char *)this,pcVar1,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    goto switchD_00107600_default;
  case 0xd:
    pcVar1 = "Invalid ROM command: [";
    break;
  case 0xe:
    pcVar1 = "ALARM SEARCH ROM command: [";
    break;
  default:
    goto switchD_00107600_default;
  }
  AnalyzerResults::AddTabularText((char *)this,pcVar1,local_98,"]",(char *)0x0,(char *)0x0);
switchD_00107600_default:
  Frame::~Frame(local_c0);
  return;
}

Assistant:

void OneWireAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    Frame frame = GetFrame( frame_index );
    ClearTabularText();

    bool warning_flag = false;
    if( ( frame.mFlags & DISPLAY_AS_WARNING_FLAG ) != 0 )
        warning_flag = true;


    // RestartPulse, PresencePulse, ReadRomFrame, SkipRomFrame, SearchRomFrame,  AlarmSearchFrame, MatchRomFrame, OverdriveSkipRomFrame,
    // OverdriveMatchRomFrame, CRC, FamilyCode, Rom, Byte, Bit
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    switch( ( OneWireFrameType )frame.mType )
    {
    case RestartPulse:
    {
        if( warning_flag == false )
        {
            AddTabularText( "RESET condition" );
        }
        else
        {
            AddTabularText( "RESET - warning, pulse shorter than 480us" );
        }
    }
    break;
    case PresencePulse:
    {
        AddTabularText( "PRESENCE condition" );
    }
    break;
    case ReadRomFrame:
    {
        AddTabularText( "READ ROM command: [", number_str, "]" );
    }
    break;
    case SkipRomFrame:
    {
        AddTabularText( "SKIP ROM command: [", number_str, "]" );
    }
    break;
    case SearchRomFrame:
    {
        AddTabularText( "SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case AlarmSearchFrame:
    {
        AddTabularText( "ALARM SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case MatchRomFrame:
    {
        AddTabularText( "MATCH ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveSkipRomFrame:
    {
        AddTabularText( "OVERDRIVE SKIP ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveMatchRomFrame:
    {
        AddTabularText( "OVERDRIVE MATCH ROM command: [", number_str, "]" );
    }
    break;
    case CRC:
    {
        AddTabularText( "CRC section from ROM: [", number_str, "]" );
    }
    break;
    case FamilyCode:
    {
        AddTabularText( "FAMILY CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Rom:
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 48, number_str, 128 );
        AddTabularText( "ROM CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Byte:
    {
        AddTabularText( "DATA: [", number_str, "]" );
    }
    break;
    case Bit:
    {
        AddTabularText( "BIT - ERROR." );
    }
    break;
    case InvalidRomCommandFrame:
    {
        AddTabularText( "Invalid ROM command: [", number_str, "]" );
    }
    break;
    }
}